

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::LogToAllLogfiles
               (LogSeverity severity,time_t timestamp,char *message,size_t len)

{
  undefined4 local_2c;
  int i;
  size_t len_local;
  char *message_local;
  time_t timestamp_local;
  LogSeverity severity_local;
  
  local_2c = severity;
  if ((fLB::FLAGS_logtostderr & 1) == 0) {
    for (; -1 < local_2c; local_2c = local_2c + -1) {
      MaybeLogToLogfile(local_2c,timestamp,message,len);
    }
  }
  else {
    ColoredWriteToStderr(severity,message,len);
  }
  return;
}

Assistant:

inline void LogDestination::LogToAllLogfiles(LogSeverity severity,
                                             time_t timestamp,
                                             const char* message,
                                             size_t len) {

  if ( FLAGS_logtostderr ) {           // global flag: never log to file
    ColoredWriteToStderr(severity, message, len);
  } else {
    for (int i = severity; i >= 0; --i)
      LogDestination::MaybeLogToLogfile(i, timestamp, message, len);
  }
}